

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  ushort uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  byte bVar4;
  long lVar5;
  stbi_uc *psVar6;
  int iVar7;
  ulong uVar8;
  stbi__uint16 *psVar9;
  long lVar10;
  uint uVar11;
  
  iVar7 = 0;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
    for (lVar10 = 0; (int)lVar10 < count[lVar5]; lVar10 = lVar10 + 1) {
      h->size[lVar10 + iVar7] = (char)lVar5 + '\x01';
    }
    iVar7 = iVar7 + (int)lVar10;
  }
  h->size[iVar7] = '\0';
  uVar11 = 0;
  uVar2 = 1;
  iVar7 = 0;
  do {
    if (uVar2 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      memset(h,0xff,0x200);
      uVar8 = 0;
      uVar2 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar2 = uVar8;
      }
      for (; uVar8 != uVar2; uVar8 = uVar8 + 1) {
        if (h->size[uVar8] < 10) {
          uVar1 = h->code[uVar8];
          bVar4 = 9 - h->size[uVar8];
          for (lVar5 = 0; (uint)lVar5 >> (bVar4 & 0x1f) == 0; lVar5 = lVar5 + 1) {
            h->fast[lVar5 + ((ulong)uVar1 << (bVar4 & 0x3f))] = (stbi_uc)uVar8;
          }
        }
      }
      return 1;
    }
    h->delta[uVar2] = uVar11 - iVar7;
    uVar8 = (ulong)h->size[(int)uVar11];
    if (uVar2 == uVar8) {
      psVar9 = h->code + (int)uVar11;
      psVar6 = h->size + (long)(int)uVar11 + 1;
      while (uVar2 == uVar8) {
        *psVar9 = (stbi__uint16)iVar7;
        iVar7 = iVar7 + 1;
        bVar4 = *psVar6;
        uVar11 = uVar11 + 1;
        psVar9 = psVar9 + 1;
        psVar6 = psVar6 + 1;
        uVar8 = (ulong)bVar4;
      }
      if (iVar7 - 1U >> ((byte)uVar2 & 0x1f) != 0) {
        puVar3 = (undefined8 *)__tls_get_addr(&PTR_00127e20);
        *puVar3 = "bad code lengths";
        return 0;
      }
    }
    h->maxcode[uVar2] = iVar7 << (0x10 - (byte)uVar2 & 0x1f);
    iVar7 = iVar7 * 2;
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i)
      for (j=0; j < count[i]; ++j)
         h->size[k++] = (stbi_uc) (i+1);
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}